

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idec_dec.c
# Opt level: O0

WebPIDecoder * NewDecoder(WebPDecBuffer *output_buffer,WebPBitstreamFeatures *features)

{
  int iVar1;
  uint64_t in_RSI;
  WebPDecBuffer *in_RDI;
  WebPIDecoder *idec;
  WebPBitstreamFeatures *in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  WebPIDecoder *local_8;
  
  local_8 = (WebPIDecoder *)WebPSafeCalloc(in_RSI,in_stack_ffffffffffffffe0);
  if (local_8 == (WebPIDecoder *)0x0) {
    local_8 = (WebPIDecoder *)0x0;
  }
  else {
    local_8->state = STATE_WEBP_HEADER;
    local_8->chunk_size = 0;
    local_8->last_mb_y = -1;
    InitMemBuffer(&local_8->mem);
    iVar1 = WebPInitDecBuffer((WebPDecBuffer *)0x10d224);
    if ((iVar1 == 0) || (iVar1 = VP8InitIo((VP8Io *)0x10d23a), iVar1 == 0)) {
      WebPSafeFree((void *)0x10d249);
      local_8 = (WebPIDecoder *)0x0;
    }
    else {
      WebPResetDecParams((WebPDecParams *)0x10d265);
      if ((in_RDI == (WebPDecBuffer *)0x0) ||
         (iVar1 = WebPAvoidSlowMemory((WebPDecBuffer *)local_8,in_stack_ffffffffffffffd8),
         iVar1 != 0)) {
        (local_8->params).output = &local_8->output;
        local_8->final_output = in_RDI;
        if (in_RDI != (WebPDecBuffer *)0x0) {
          ((local_8->params).output)->colorspace = in_RDI->colorspace;
        }
      }
      else {
        (local_8->params).output = in_RDI;
        local_8->final_output = (WebPDecBuffer *)0x0;
      }
      WebPInitCustomIo(&local_8->params,&local_8->io);
    }
  }
  return local_8;
}

Assistant:

WEBP_NODISCARD static WebPIDecoder* NewDecoder(
    WebPDecBuffer* const output_buffer,
    const WebPBitstreamFeatures* const features) {
  WebPIDecoder* idec = (WebPIDecoder*)WebPSafeCalloc(1ULL, sizeof(*idec));
  if (idec == NULL) {
    return NULL;
  }

  idec->state = STATE_WEBP_HEADER;
  idec->chunk_size = 0;

  idec->last_mb_y = -1;

  InitMemBuffer(&idec->mem);
  if (!WebPInitDecBuffer(&idec->output) || !VP8InitIo(&idec->io)) {
    WebPSafeFree(idec);
    return NULL;
  }

  WebPResetDecParams(&idec->params);
  if (output_buffer == NULL || WebPAvoidSlowMemory(output_buffer, features)) {
    idec->params.output = &idec->output;
    idec->final_output = output_buffer;
    if (output_buffer != NULL) {
      idec->params.output->colorspace = output_buffer->colorspace;
    }
  } else {
    idec->params.output = output_buffer;
    idec->final_output = NULL;
  }
  WebPInitCustomIo(&idec->params, &idec->io);  // Plug the I/O functions.

  return idec;
}